

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_zone.cpp
# Opt level: O2

void __thiscall
sf2cute::SFInstrumentZone::SFInstrumentZone(SFInstrumentZone *this,SFInstrumentZone *origin)

{
  SFZone::SFZone(&this->super_SFZone,&origin->super_SFZone);
  (this->super_SFZone)._vptr_SFZone = (_func_int **)&PTR__SFInstrumentZone_0011d7c8;
  std::__weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            (&(this->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>,
             &(origin->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>);
  this->parent_instrument_ = (SFInstrument *)0x0;
  return;
}

Assistant:

SFInstrumentZone::SFInstrumentZone(const SFInstrumentZone & origin) :
    SFZone(origin),
    sample_(origin.sample_),
    parent_instrument_(nullptr) {
}